

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::Tag::SimpleTag::Write(SimpleTag *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar6;
  uint64_t uVar7;
  
  uVar4 = EbmlElementSize(0x45a3,this->tag_name_);
  uVar5 = EbmlElementSize(0x4487,this->tag_string_);
  uVar5 = uVar5 + uVar4;
  uVar4 = EbmlMasterElementSize(0x67c8,uVar5);
  uVar7 = uVar4 + uVar5;
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    bVar1 = WriteEbmlMasterElement(writer,0x67c8,uVar5);
    if (((bVar1) && (bVar1 = WriteEbmlElement(writer,0x45a3,this->tag_name_), bVar1)) &&
       (bVar1 = WriteEbmlElement(writer,0x4487,this->tag_string_), bVar1)) {
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      uVar6 = 0;
      if (CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar7) {
        uVar6 = uVar7;
      }
      if (CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) {
        uVar7 = uVar6;
      }
    }
    else {
      uVar7 = 0;
    }
  }
  return uVar7;
}

Assistant:

uint64_t Tag::SimpleTag::Write(IMkvWriter* writer) const {
  uint64_t payload_size = EbmlElementSize(libwebm::kMkvTagName, tag_name_);

  payload_size += EbmlElementSize(libwebm::kMkvTagString, tag_string_);

  const uint64_t simple_tag_size =
      EbmlMasterElementSize(libwebm::kMkvSimpleTag, payload_size) +
      payload_size;

  if (writer == NULL)
    return simple_tag_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvSimpleTag, payload_size))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvTagName, tag_name_))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvTagString, tag_string_))
    return 0;

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != simple_tag_size)
    return 0;

  return simple_tag_size;
}